

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O3

List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *
Lib::List<Inferences::ALASCA::BinaryResolutionConf::Lhs>::cons
          (Lhs *elem,List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *l)

{
  bool bVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  Clause *pCVar6;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *pLVar7;
  
  pLVar7 = (List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)
           FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  bVar1 = (elem->super_SelectedLiteral).interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._isSome;
  if (bVar1 == false) {
    pCVar6 = (elem->super_SelectedLiteral).cl;
    (pLVar7->_head).super_SelectedLiteral.litIdx = (elem->super_SelectedLiteral).litIdx;
    (pLVar7->_head).super_SelectedLiteral.cl = pCVar6;
  }
  else {
    bVar2 = *(byte *)&(elem->super_SelectedLiteral).interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem;
    uVar3 = *(undefined4 *)
             ((long)&(elem->super_SelectedLiteral).interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 0x11);
    uVar5 = *(undefined8 *)
             ((long)&(elem->super_SelectedLiteral).interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 9);
    uVar4 = *(undefined4 *)
             ((long)&(elem->super_SelectedLiteral).interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 1);
    pCVar6 = (elem->super_SelectedLiteral).cl;
    (pLVar7->_head).super_SelectedLiteral.litIdx = (elem->super_SelectedLiteral).litIdx;
    (pLVar7->_head).super_SelectedLiteral.cl = pCVar6;
    *(undefined8 *)
     &(pLVar7->_head).super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem = 0;
    *(undefined8 *)
     ((long)&(pLVar7->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 8) = 0;
    *(undefined8 *)
     ((long)&(pLVar7->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0xc) = 0;
    *(undefined8 *)
     ((long)&(pLVar7->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0x14) = 0;
    *(byte *)&(pLVar7->_head).super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem = bVar2 & 3;
    *(undefined4 *)
     ((long)&(pLVar7->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 1) = uVar4;
    *(undefined8 *)
     ((long)&(pLVar7->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 9) = uVar5;
    *(undefined4 *)
     ((long)&(pLVar7->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0x11) = uVar3;
  }
  (pLVar7->_head).super_SelectedLiteral.interpreted.
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ._isSome = bVar1;
  pLVar7->_tail = l;
  return pLVar7;
}

Assistant:

static List* cons(C elem, List* l)
  {
    return new List(elem, l);
  }